

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3e524f::BuildSystemFrontendExecutionQueueDelegate::processStarted
          (BuildSystemFrontendExecutionQueueDelegate *this,ProcessContext *command,
          ProcessHandle handle,llbuild_pid_t pid)

{
  BuildSystem *this_00;
  BuildSystemDelegate *pBVar1;
  
  this_00 = (this->delegateImpl->frontend->system)._M_t.
            super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            ._M_t.
            super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>._M_head_impl;
  if (this_00 != (BuildSystem *)0x0) {
    pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(this_00);
    (*pBVar1->_vptr_BuildSystemDelegate[0x17])
              (pBVar1,command,handle.id,pBVar1->_vptr_BuildSystemDelegate[0x17]);
    return;
  }
  __assert_fail("delegateImpl.frontend->system",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemFrontend.cpp"
                ,0x1f0,
                "BuildSystem &(anonymous namespace)::BuildSystemFrontendExecutionQueueDelegate::getSystem() const"
               );
}

Assistant:

virtual void processStarted(ProcessContext* command,
                              ProcessHandle handle,
                              llbuild_pid_t pid) override {
    static_cast<BuildSystemFrontendDelegate*>(&getSystem().getDelegate())->
      commandProcessStarted(
          reinterpret_cast<Command*>(command),
          BuildSystemFrontendDelegate::ProcessHandle { handle.id });
  }